

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *this_00;
  void *pvVar4;
  ostream *in_RSI;
  ulong in_RDI;
  char c;
  size_t i;
  ulong local_18;
  
  for (local_18 = 0; uVar2 = std::__cxx11::string::size(), local_18 < uVar2; local_18 = local_18 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar3;
    switch(cVar1) {
    case '\"':
      if (*(int *)(in_RDI + 0x20) == 1) {
        std::operator<<(in_RSI,"&quot;");
      }
      else {
        std::operator<<(in_RSI,cVar1);
      }
      break;
    default:
      if (((cVar1 < '\t') || (('\r' < cVar1 && (cVar1 < ' ')))) || (cVar1 == '\x7f')) {
        this_00 = std::operator<<(in_RSI,"&#x");
        pvVar4 = (void *)std::ostream::operator<<(this_00,std::uppercase);
        pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::hex);
        std::ostream::operator<<(pvVar4,(int)cVar1);
      }
      else {
        std::operator<<(in_RSI,cVar1);
      }
      break;
    case '&':
      std::operator<<(in_RSI,"&amp;");
      break;
    case '<':
      std::operator<<(in_RSI,"&lt;");
      break;
    case '>':
      if (((local_18 < 3) ||
          (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 != ']')) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 != ']')) {
        std::operator<<(in_RSI,cVar1);
      }
      else {
        std::operator<<(in_RSI,"&gt;");
      }
    }
  }
  return;
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << static_cast<int>( c );
                        else
                            os << c;
                }
            }
        }